

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long in_FS_OFFSET;
  bool bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -NAN;
  dStack_40 = -NAN;
  *pResult = 0.0;
  iVar6 = 0;
  if (length != 0) {
    if (enc == '\x01') {
      iVar12 = 1;
      lVar9 = 1;
      pbVar10 = (byte *)z;
    }
    else {
      uVar13 = 3 - enc;
      uVar5 = (ulong)uVar13;
      iVar12 = 1;
      if ((int)uVar13 < (int)(length & 0xfffffffeU)) {
        uVar5 = (ulong)(int)(3 - (uint)enc);
        do {
          if (z[uVar5] != '\0') {
            iVar12 = -100;
            goto LAB_0014403d;
          }
          uVar5 = uVar5 + 2;
        } while ((long)uVar5 < (long)(int)(length & 0xfffffffeU));
        iVar12 = 1;
      }
LAB_0014403d:
      length = (uint)uVar5 ^ 1;
      pbVar10 = (byte *)(z + (enc & 1));
      lVar9 = 2;
    }
    pbVar7 = (byte *)(z + length);
    for (; pbVar10 < pbVar7; pbVar10 = pbVar10 + lVar9) {
      bVar1 = *pbVar10;
      if ((""[bVar1] & 1) == 0) {
        iVar11 = 0;
        lVar4 = 0;
        if ((bVar1 - 0x2b & 0xfd) == 0) {
          lVar4 = lVar9;
        }
        pbVar10 = pbVar10 + lVar4;
        bVar3 = true;
        if (pbVar7 <= pbVar10) goto LAB_00144205;
        iVar11 = 0;
        iVar6 = 0;
        uVar5 = 0;
        goto LAB_001440b8;
      }
    }
  }
LAB_0014450d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
LAB_001440b8:
  bVar2 = *pbVar10;
  if (0xfffffffffffffff5 < (ulong)bVar2 - 0x3a) {
    uVar5 = ((long)(char)bVar2 + uVar5 * 10) - 0x30;
    pbVar10 = pbVar10 + lVar9;
    if (0x1999999999999997 < uVar5) {
      for (; (pbVar10 < pbVar7 && (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a));
          pbVar10 = pbVar10 + lVar9) {
        iVar6 = iVar6 + 1;
      }
    }
    iVar11 = iVar11 + 1;
    if (pbVar7 <= pbVar10) goto LAB_001441a7;
    goto LAB_001440b8;
  }
  if (bVar2 == 0x2e) {
    iVar12 = iVar12 + 1;
    while ((pbVar10 = pbVar10 + lVar9, pbVar10 < pbVar7 &&
           (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a))) {
      if (uVar5 < 0x1999999999999998) {
        uVar5 = ((long)(char)*pbVar10 + uVar5 * 10) - 0x30;
        iVar6 = iVar6 + -1;
        iVar11 = iVar11 + 1;
      }
    }
  }
  if (pbVar10 < pbVar7) {
    if ((*pbVar10 | 0x20) == 0x65) {
      pbVar10 = pbVar10 + lVar9;
      iVar12 = iVar12 + 1;
      if (pbVar7 <= pbVar10) {
        iVar17 = 0;
        iVar15 = 1;
        bVar3 = false;
        goto LAB_001441b5;
      }
      iVar15 = 1;
      if (*pbVar10 == 0x2b) {
        pbVar10 = pbVar10 + lVar9;
      }
      else if (*pbVar10 == 0x2d) {
        pbVar10 = pbVar10 + lVar9;
        iVar15 = -1;
      }
      iVar17 = 0;
      if ((pbVar10 < pbVar7) && (uVar8 = (ulong)*pbVar10, 0xfffffffffffffff5 < uVar8 - 0x3a)) {
        iVar16 = 0;
        do {
          pbVar10 = pbVar10 + lVar9;
          iVar17 = (char)uVar8 + -0x30 + iVar16 * 10;
          if (9999 < iVar16) {
            iVar17 = 10000;
          }
          bVar3 = true;
          if (pbVar7 <= pbVar10) goto LAB_001445e5;
          uVar8 = (ulong)*pbVar10;
          iVar16 = iVar17;
        } while (0xfffffffffffffff5 < uVar8 - 0x3a);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      iVar17 = 0;
      iVar15 = 1;
      bVar3 = true;
    }
LAB_001445e5:
    while ((pbVar10 < pbVar7 && ((""[*pbVar10] & 1) != 0))) {
      pbVar10 = pbVar10 + lVar9;
    }
  }
  else {
LAB_001441a7:
    iVar17 = 0;
    iVar15 = 1;
    bVar3 = true;
  }
LAB_001441b5:
  if (uVar5 == 0) {
LAB_00144205:
    if (bVar1 == 0x2d) {
      dVar19 = -0.0;
    }
    else {
      dVar19 = 0.0;
    }
LAB_001444cf:
    *pResult = dVar19;
  }
  else {
    uVar13 = iVar17 * iVar15 + iVar6;
    if ((uVar13 == 0 || SCARRY4(iVar17 * iVar15,iVar6) != (int)uVar13 < 0) ||
       (0x19999999999998cb < uVar5)) {
      uVar8 = uVar5;
      uVar14 = uVar13;
      if (((int)uVar13 < 0) && (uVar5 == (uVar5 / 5 & 0xfffffffffffffffe) * 5)) {
        iVar6 = -uVar13;
        do {
          uVar5 = uVar5 / 10;
          iVar15 = iVar6 + -1;
          if (iVar6 == 1) break;
          iVar6 = iVar15;
        } while (uVar5 == (uVar5 / 10) * 10);
        uVar8 = uVar5;
        uVar14 = -iVar15;
      }
    }
    else {
      do {
        uVar8 = uVar5 * 10;
        uVar14 = uVar13 - 1;
        if (uVar13 < 2) break;
        bVar18 = uVar5 < 0x28f5c28f5c28f48;
        uVar5 = uVar8;
        uVar13 = uVar14;
      } while (bVar18);
    }
    auVar20._8_4_ = (int)(uVar8 >> 0x20);
    auVar20._0_8_ = uVar8;
    auVar20._12_4_ = 0x45300000;
    local_48 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    dStack_40 = 0.0;
    if (local_48 <= 1.844674407370955e+19) {
      uVar5 = (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48;
      lVar9 = uVar8 - uVar5;
      if (uVar8 < uVar5) {
        lVar9 = uVar5 - uVar8;
        auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar22._0_8_ = lVar9;
        auVar22._12_4_ = 0x45300000;
        dStack_40 = -((auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
      }
      else {
        auVar23._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar23._0_8_ = lVar9;
        auVar23._12_4_ = 0x45300000;
        dStack_40 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
      }
    }
    if ((int)uVar14 < 1) {
      uVar13 = uVar14;
      if ((int)uVar14 < -99) {
        do {
          uVar14 = uVar13 + 100;
          dekkerMul2(&local_48,1e-100,-1.9991899802602883e-117);
          bVar18 = uVar13 < 0xffffff39;
          uVar13 = uVar14;
        } while (bVar18);
      }
      uVar13 = uVar14;
      if ((int)uVar14 < -9) {
        do {
          uVar14 = uVar13 + 10;
          dekkerMul2(&local_48,1e-10,-3.643219731549774e-27);
          bVar18 = uVar13 < 0xffffffed;
          uVar13 = uVar14;
        } while (bVar18);
      }
      if ((int)uVar14 < 0) {
        do {
          dekkerMul2(&local_48,0.1,-5.551115123125783e-18);
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0);
      }
    }
    else {
      if (99 < uVar14) {
        do {
          uVar14 = uVar14 - 100;
          dekkerMul2(&local_48,1e+100,-1.5902891109759918e+83);
        } while (99 < uVar14);
      }
      if (9 < uVar14) {
        do {
          uVar14 = uVar14 - 10;
          dekkerMul2(&local_48,10000000000.0,0.0);
        } while (9 < uVar14);
      }
      if (uVar14 != 0) {
        uVar14 = uVar14 + 1;
        do {
          dekkerMul2(&local_48,10.0,0.0);
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
      }
    }
    dVar19 = local_48 + dStack_40;
    dVar21 = dVar19;
    if (((ulong)dVar19 & 0xfffffffffffff) != 0) {
      dVar21 = INFINITY;
    }
    if ((~(ulong)dVar19 & 0x7ff0000000000000) == 0) {
      dVar19 = dVar21;
    }
    *pResult = dVar19;
    if (bVar1 == 0x2d) {
      dVar19 = (double)((ulong)dVar19 ^ (ulong)DAT_00208f20);
      goto LAB_001444cf;
    }
  }
  if (((((!bVar3) || (pbVar10 != pbVar7)) || (iVar11 < 1)) || (iVar6 = iVar12, iVar12 < 1)) &&
     (((iVar12 < 2 || (!bVar3 && iVar12 != 3)) || (iVar6 = -1, iVar11 < 1)))) {
    iVar6 = 0;
  }
  goto LAB_0014450d;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */
  u64 s2;          /* round-tripped significand */
  double rr[2];

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<((LARGEST_UINT64-0x7ff)/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  rr[0] = (double)s;
  assert( sizeof(s2)==sizeof(rr[0]) );
#ifdef SQLITE_DEBUG
  rr[1] = 18446744073709549568.0;
  memcpy(&s2, &rr[1], sizeof(s2));
  assert( s2==0x43efffffffffffffLL );
#endif
  /* Largest double that can be safely converted to u64
  **         vvvvvvvvvvvvvvvvvvvvvv   */
  if( rr[0]<=18446744073709549568.0 ){
    s2 = (u64)rr[0];
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
  }else{
    rr[1] = 0.0;
  }
  assert( rr[1]<=1.0e-10*rr[0] );  /* Equal only when rr[0]==0.0 */

  if( e>0 ){
    while( e>=100  ){
      e -= 100;
      dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
    }
    while( e>=10   ){
      e -= 10;
      dekkerMul2(rr, 1.0e+10, 0.0);
    }
    while( e>=1    ){
      e -= 1;
      dekkerMul2(rr, 1.0e+01, 0.0);
    }
  }else{
    while( e<=-100 ){
      e += 100;
      dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
    }
    while( e<=-10  ){
      e += 10;
      dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
    }
    while( e<=-1   ){
      e += 1;
      dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
    }
  }
  *pResult = rr[0]+rr[1];
  if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}